

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preview.c
# Opt level: O0

exr_result_t
exr_attr_preview_create(exr_context_t ctxt,exr_attr_preview_t *p,uint32_t w,uint32_t h,uint8_t *d)

{
  exr_result_t eVar1;
  ulong __n;
  uint32_t in_ECX;
  uint32_t in_EDX;
  exr_attr_preview_t *in_RSI;
  exr_context_t in_RDI;
  void *in_R8;
  size_t copybytes;
  exr_result_t rv;
  
  eVar1 = exr_attr_preview_init(in_RDI,in_RSI,in_EDX,in_ECX);
  if ((eVar1 == 0) && (__n = (ulong)(in_EDX * in_ECX * 4), __n != 0)) {
    memcpy(in_RSI->rgba,in_R8,__n);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_preview_create (
    exr_context_t       ctxt,
    exr_attr_preview_t* p,
    uint32_t            w,
    uint32_t            h,
    const uint8_t*      d)
{
    exr_result_t rv = exr_attr_preview_init (ctxt, p, w, h);
    if (rv == EXR_ERR_SUCCESS)
    {
        size_t copybytes = w * h * 4;
        if (copybytes > 0)
            memcpy (EXR_CONST_CAST (uint8_t*, p->rgba), d, copybytes);
    }
    return rv;
}